

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deTimer.c
# Opt level: O0

deBool deTimer_scheduleInterval(deTimer *timer,int milliseconds)

{
  int iVar1;
  undefined1 local_40 [8];
  itimerspec tspec;
  int milliseconds_local;
  deTimer *timer_local;
  
  if (timer->isActive == 0) {
    local_40 = (undefined1  [8])(long)(milliseconds / 1000);
    tspec.it_interval.tv_sec = (__time_t)((milliseconds % 1000) * 1000);
    tspec.it_interval.tv_nsec = (__syscall_slong_t)local_40;
    tspec.it_value.tv_sec = tspec.it_interval.tv_sec;
    tspec.it_value.tv_nsec._4_4_ = milliseconds;
    iVar1 = timer_settime(timer->timer,0,(itimerspec *)local_40,(itimerspec *)0x0);
    if (iVar1 == 0) {
      timer->isActive = 1;
      timer_local._4_4_ = 1;
    }
    else {
      timer_local._4_4_ = 0;
    }
  }
  else {
    timer_local._4_4_ = 0;
  }
  return timer_local._4_4_;
}

Assistant:

deBool deTimer_scheduleInterval (deTimer* timer, int milliseconds)
{
	struct itimerspec tspec;

	DE_ASSERT(timer && milliseconds > 0);

	if (timer->isActive)
		return DE_FALSE;

	tspec.it_value.tv_sec		= milliseconds / 1000;
	tspec.it_value.tv_nsec		= (milliseconds % 1000) * 1000;
	tspec.it_interval.tv_sec	= tspec.it_value.tv_sec;
	tspec.it_interval.tv_nsec	= tspec.it_value.tv_nsec;

	if (timer_settime(timer->timer, 0, &tspec, DE_NULL) != 0)
		return DE_FALSE;

	timer->isActive = DE_TRUE;
	return DE_TRUE;
}